

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.cpp
# Opt level: O1

void doTest(TestStartupParamsAndResults *startupParams)

{
  size_t sVar1;
  id iVar2;
  id __tmp;
  ThreadTestRes *pTVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  TestStartupParamsAndResults *pTVar7;
  size_t *psVar8;
  size_t sVar9;
  char *pcVar10;
  size_t i;
  unsigned_long uVar11;
  byte bVar12;
  thread t1;
  thread threads [32];
  ThreadStartupParamsAndResults testParams [32];
  ModuleID local_f48;
  thread local_f40;
  native_handle_type local_f38 [32];
  char local_e38 [104];
  long local_dd0 [436];
  
  bVar12 = 0;
  sVar1 = (startupParams->startupParams).threadCount;
  lVar6 = 0x100;
  memset(local_f38,0,0x100);
  if (sVar1 != 0) {
    pTVar3 = startupParams->testRes->threadResPerThreadAlloc;
    plVar5 = local_dd0;
    sVar9 = 0;
    do {
      pTVar7 = startupParams;
      psVar8 = (size_t *)(plVar5 + -0xd);
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *psVar8 = (pTVar7->startupParams).threadCount;
        pTVar7 = (TestStartupParamsAndResults *)((long)pTVar7 + (ulong)bVar12 * -0x10 + 8);
        psVar8 = psVar8 + (ulong)bVar12 * -2 + 1;
      }
      plVar5[-3] = sVar9;
      plVar5[-2] = (long)(pTVar3 + -0x40);
      plVar5[-1] = (long)(pTVar3 + -0x20);
      *plVar5 = (long)pTVar3;
      sVar9 = sVar9 + 1;
      pTVar3 = pTVar3 + 1;
      plVar5 = plVar5 + 0xe;
    } while (sVar1 != sVar9);
    pcVar10 = local_e38;
    uVar11 = 0;
    do {
      local_f48.str = (char *)0x0;
      nodecpp::log::default_log::log<char_const*,unsigned_long>
                (&local_f48,info,"about to run thread {}...",uVar11);
      local_f48.str = pcVar10;
      std::thread::thread<void*(&)(void*),void*,void>(&local_f40,runRandomTest,&local_f48.str);
      iVar2._M_thread = local_f38[uVar11];
      if (iVar2._M_thread != 0) goto LAB_00103e45;
      ((id *)(local_f38 + uVar11))->_M_thread = (native_handle_type)local_f40._M_id._M_thread;
      local_f48.str = (char *)0x0;
      local_f40._M_id._M_thread = (id)(id)iVar2._M_thread;
      nodecpp::log::default_log::log<char_const*>(&local_f48,info,"    ...done");
      if (local_f40._M_id._M_thread != 0) goto LAB_00103e45;
      uVar11 = uVar11 + 1;
      pcVar10 = pcVar10 + 0x70;
    } while (sVar1 != uVar11);
    uVar11 = 0;
    do {
      local_f48.str = (char *)0x0;
      nodecpp::log::default_log::log<char_const*,unsigned_long>
                (&local_f48,info,"joining thread {}...",uVar11);
      std::thread::join();
      local_f48.str = (char *)0x0;
      nodecpp::log::default_log::log<char_const*>(&local_f48,info,"    ...done");
      uVar11 = uVar11 + 1;
    } while (sVar1 != uVar11);
  }
  while (*(long *)((long)local_f38 + lVar6 + -8) == 0) {
    lVar6 = lVar6 + -8;
    if (lVar6 == 0) {
      return;
    }
  }
LAB_00103e45:
  std::terminate();
}

Assistant:

void doTest( TestStartupParamsAndResults* startupParams )
{
	size_t testThreadCount = startupParams->startupParams.threadCount;

	ThreadStartupParamsAndResults testParams[max_threads];
	std::thread threads[ max_threads ];

	for ( size_t i=0; i<testThreadCount; ++i )
	{
		memcpy( testParams + i, startupParams, sizeof(TestStartupParams) );
		testParams[i].threadID = i;
		testParams[i].threadResEmpty = startupParams->testRes->threadResEmpty + i;
		testParams[i].threadResNewDel = startupParams->testRes->threadResNewDel + i;
		testParams[i].threadResPerThreadAlloc = startupParams->testRes->threadResPerThreadAlloc + i;
	}

	// run thread
	for ( size_t i=0; i<testThreadCount; ++i )
	{
		nodecpp::log::default_log::info( "about to run thread {}...", i );
		std::thread t1( runRandomTest, (void*)(testParams + i) );
		threads[i] = std::move( t1 );
//		t1.detach();
		nodecpp::log::default_log::info( "    ...done" );
	}
	// join threads
	for ( size_t i=0; i<testThreadCount; ++i )
	{
		nodecpp::log::default_log::info( "joining thread {}...", i );
		threads[i].join();
		nodecpp::log::default_log::info( "    ...done" );
	}
}